

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

RegVmReturnType __thiscall
ExecutorRegVm::ExecReturn
          (ExecutorRegVm *this,RegVmCmd cmd,RegVmCmd *instruction,RegVmRegister *regFilePtr)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar5;
  ulong uVar6;
  RegVmReturnType RVar7;
  uint *puVar8;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *__dest;
  RegVmCmd *local_38;
  
  RVar7 = cmd._2_4_ & 0xff;
  if (cmd.rB != '\0') {
    if (RVar7 == rvrError) {
      uVar3 = (this->callStack).count;
      local_38 = instruction + 1;
      if (uVar3 == (this->callStack).max) {
        FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar3,&local_38);
      }
      else {
        (this->callStack).count = uVar3 + 1;
        (this->callStack).data[uVar3] = local_38;
      }
      if ((ulong)uVar3 == 0) {
        RVar7 = rvrVoid;
      }
      else {
        this->codeRunning = false;
        this->callContinue = false;
        NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                           "ERROR: function didn\'t return a value");
        this->execErrorMessage = this->execErrorBuffer;
        (this->execErrorObject).typeID = 0;
        (this->execErrorObject).ptr = (char *)0x0;
        RVar7 = rvrError;
      }
      goto LAB_001436cf;
    }
    puVar8 = (this->exLinker->exRegVmConstants).data;
    uVar6 = (ulong)cmd >> 0x20;
    uVar3 = puVar8[uVar6];
    uVar4 = puVar8[uVar6 + 2];
    if (uVar4 != 7) {
      puVar8 = puVar8 + uVar6 + 2;
      __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
      do {
        switch(uVar4) {
        case 2:
          uVar4 = regFilePtr[puVar8[1]].field_0.intValue;
          goto LAB_001435f2;
        case 3:
          aVar5 = regFilePtr[puVar8[1]].field_0;
          goto LAB_00143610;
        case 4:
          uVar4 = puVar8[1];
LAB_001435f2:
          puVar8 = puVar8 + 2;
          __dest->intValue = uVar4;
          __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)__dest + 4);
          break;
        case 5:
          aVar5.longValue._4_4_ = 0;
          aVar5.intValue = puVar8[1];
LAB_00143610:
          puVar8 = puVar8 + 2;
          *__dest = aVar5;
          __dest = __dest + 1;
          break;
        case 6:
          puVar1 = puVar8 + 1;
          puVar2 = puVar8 + 2;
          uVar4 = puVar8[3];
          puVar8 = puVar8 + 4;
          memcpy(__dest,(void *)((ulong)*puVar2 + regFilePtr[*puVar1].field_0.longValue),
                 (ulong)uVar4);
          __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                   ((long)__dest + (ulong)(uVar4 & 0xfffffffc));
          break;
        default:
          puVar8 = puVar8 + 1;
        }
        uVar4 = *puVar8;
      } while (uVar4 != 7);
    }
    if (cmd.rC != '\0') {
      ExecCheckedReturn(this,uVar3,regFilePtr);
    }
  }
  uVar3 = (this->callStack).count;
  if (uVar3 != this->lastFinalReturn) {
    if (uVar3 != 0) {
      (this->callStack).count = uVar3 - 1;
      return RVar7;
    }
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x73,
                  "void FastVector<RegVmCmd *>::pop_back() [T = RegVmCmd *, zeroNewMemory = false, skipConstructor = false]"
                 );
  }
  if (this->lastFinalReturn != 0) {
    return RVar7;
  }
LAB_001436cf:
  this->codeRunning = false;
  return RVar7;
}

Assistant:

RegVmReturnType ExecutorRegVm::ExecReturn(const RegVmCmd cmd, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	if(cmd.rB == rvrError)
	{
		bool errorState = !callStack.empty();

		callStack.push_back(instruction + 1);

		if(errorState)
			Stop("ERROR: function didn't return a value");

		codeRunning = false;

		return errorState ? rvrError : rvrVoid;
	}

	if(cmd.rB != rvrVoid)
	{
		unsigned *microcode = exLinker->exRegVmConstants.data + cmd.argument;

		unsigned typeId = *microcode++;

		// Skip type size
		microcode++;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPush:
				*tempStackPtr = regFilePtr[*microcode++].intValue;
				tempStackPtr += 1;
				break;
			case rvmiPushQword:
				memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
				tempStackPtr += 2;
				break;
			case rvmiPushImm:
				*tempStackPtr = *microcode++;
				tempStackPtr += 1;
				break;
			case rvmiPushImmq:
				vmStoreLong(tempStackPtr, *microcode++);
				tempStackPtr += 2;
				break;
			case rvmiPushMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
				tempStackPtr += size >> 2;
			}
			break;
			}
		}

		if(cmd.rC)
			ExecCheckedReturn(typeId, regFilePtr);
	}

	if(callStack.size() == lastFinalReturn)
	{
		if(lastFinalReturn == 0)
			codeRunning = false;

		return RegVmReturnType(cmd.rB);
	}

	callStack.pop_back();

	return RegVmReturnType(cmd.rB);
}